

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FillPatchUtil_I.H
# Opt level: O1

enable_if_t<IsFabArray<MultiFab>::value>
amrex::
InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
          (MultiFab *mf,IntVect *nghost,Real time,MultiFab *cmf,int scomp,int dcomp,int ncomp,
          Geometry *cgeom,Geometry *fgeom,
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *cbc,
          int cbccomp,
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *fbc,
          int fbccomp,IntVect *ratio,InterpBase *mapper,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcscomp,
          NullInterpHook<amrex::FArrayBox> *pre_interp,NullInterpHook<amrex::FArrayBox> *post_interp
          )

{
  DistributionMapping *dm;
  int *piVar1;
  undefined8 uVar2;
  BATType BVar3;
  element_type *peVar4;
  undefined1 auVar5 [12];
  void *pvVar6;
  int i;
  IndexSpace *pIVar7;
  uint uVar8;
  undefined4 uVar9;
  long lVar10;
  uint uVar11;
  IndexType IVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  int iVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ulong uVar21;
  initializer_list<int> __l;
  allocator_type local_301;
  int local_300;
  int local_2fc;
  Box bx;
  unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_> factory;
  MFIter mfi;
  IntVect local_248;
  InterpolaterBoxCoarsener local_238;
  MultiFab mf_crse_patch;
  BoxArray ba_crse_patch;
  
  InterpBase::BoxCoarsener(mapper,ratio);
  BVar3 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type;
  uVar16 = 0;
  switch(BVar3) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar16 = *(uint *)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op
    ;
    break;
  default:
    uVar16 = *(uint *)((long)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.
                              m_bat.m_op + 4);
  }
  uVar13 = 0;
  switch(BVar3) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar13 = *(uint *)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op
    ;
    break;
  default:
    uVar13 = *(uint *)((long)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.
                              m_bat.m_op + 4);
  }
  dm = &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  uVar2 = *(undefined8 *)((fgeom->domain).smallend.vect + 2);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(fgeom->domain).bigend.vect >> 0x20);
  bx._20_8_ = *(undefined8 *)((fgeom->domain).bigend.vect + 2);
  bx.smallend.vect._0_8_ = *(undefined8 *)(fgeom->domain).smallend.vect;
  bx.smallend.vect[2] = (int)uVar2;
  bx.bigend.vect[0] = (int)((ulong)uVar2 >> 0x20);
  lVar10 = 0;
  do {
    uVar11 = 1 << ((byte)lVar10 & 0x1f);
    uVar8 = (uint)lVar10;
    bx.bigend.vect[lVar10] =
         (bx.bigend.vect[lVar10] + (uint)((uVar13 >> (uVar8 & 0x1f) & 1) != 0)) -
         (uint)((bx.btype.itype >> (uVar8 & 0x1f) & 1) != 0);
    if ((uVar13 >> (uVar8 & 0x1f) & 1) == 0) {
      IVar12.itype = ~uVar11 & bx.btype.itype;
    }
    else {
      IVar12.itype = uVar11 | bx.btype.itype;
    }
    bx.btype.itype = IVar12.itype;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    if (*(char *)((long)(fgeom->super_CoordSys).inv_dx + lVar10 + 0x19) == '\x01') {
      iVar14 = nghost->vect[lVar10];
      piVar1 = bx.smallend.vect + lVar10;
      *piVar1 = *piVar1 - iVar14;
      piVar1 = bx.bigend.vect + lVar10;
      *piVar1 = *piVar1 + iVar14;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  peVar4 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_300 = dcomp;
  local_2fc = ncomp;
  BoxArray::BoxArray(&ba_crse_patch,
                     ((long)*(pointer *)
                             ((long)&(peVar4->m_abox).
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data + 8) -
                      *(long *)&(peVar4->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7);
  peVar4 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar13 = (int)((long)*(pointer *)
                        ((long)&(peVar4->m_abox).
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data + 8) -
                 *(long *)&(peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data >> 2) * -0x49249249;
  if (0 < (int)uVar13) {
    uVar15 = 0;
    do {
      BATransformer::operator()
                ((Box *)&mfi,
                 &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat,
                 (Box *)(uVar15 * 0x1c +
                        *(long *)&(((mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                                    boxarray.m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      iVar14 = nghost->vect[0];
      uVar2 = *(undefined8 *)(nghost->vect + 1);
      iVar17 = (int)uVar2;
      iVar20 = (int)((ulong)uVar2 >> 0x20);
      auVar18._8_4_ = iVar14;
      auVar18._0_8_ = uVar2;
      auVar18._12_4_ = iVar17;
      auVar5._4_8_ = auVar18._8_8_;
      auVar5._0_4_ = iVar20 + (int)mfi.fabArray;
      auVar19._0_8_ = auVar5._0_8_ << 0x20;
      auVar19._8_4_ = iVar14 + mfi.fabArray._4_4_;
      auVar19._12_4_ = iVar17 + mfi.tile_size.vect[0];
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._0_8_ =
           auVar19._8_8_;
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
      m_bndryReg.m_crse_ratio.vect[0] = iVar20 + mfi.tile_size.vect[1];
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
      m_bndryReg.m_crse_ratio.vect[1] = mfi.tile_size.vect[2];
      lVar10 = 0;
      do {
        uVar11 = 1 << ((byte)lVar10 & 0x1f);
        uVar8 = (uint)lVar10;
        *(uint *)((long)&mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                         m_bat.m_op + lVar10 * 4) =
             (*(int *)((long)&mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                              boxarray.m_bat.m_op + lVar10 * 4) +
             (uint)((uVar16 >> (uVar8 & 0x1f) & 1) != 0)) -
             (uint)(((uint)mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                           boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] >> (uVar8 & 0x1f) & 1
                    ) != 0);
        if ((uVar16 >> (uVar8 & 0x1f) & 1) == 0) {
          mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
          m_bndryReg.m_crse_ratio.vect[1] =
               ~uVar11 & mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                         m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        }
        else {
          mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
          m_bndryReg.m_crse_ratio.vect[1] =
               uVar11 | mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                        m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
           bx.smallend.vect[0];
      if (bx.smallend.vect[0] <
          (int)mfi.m_fa._M_t.
               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl - iVar14) {
        mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
             (int)mfi.m_fa._M_t.
                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                  .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl - iVar14;
      }
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
           bx.smallend.vect[1];
      if (bx.smallend.vect[1] <
          mfi.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ - iVar17) {
        mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._4_4_ =
             mfi.m_fa._M_t.
             super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
             _M_t.
             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ - iVar17;
      }
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
           bx.smallend.vect[2];
      if (bx.smallend.vect[2] < (int)mfi.fabArray - iVar20) {
        mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type
             = (int)mfi.fabArray - iVar20;
      }
      uVar21 = CONCAT44(-(uint)((int)((ulong)mf_crse_patch.super_FabArray<amrex::FArrayBox>.
                                             super_FabArrayBase.boxarray.m_bat.m_op._0_8_ >> 0x20) <
                               bx.bigend.vect[1]),
                        -(uint)((int)mf_crse_patch.super_FabArray<amrex::FArrayBox>.
                                     super_FabArrayBase.boxarray.m_bat.m_op._0_8_ <
                               bx.bigend.vect[0]));
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._0_8_ =
           ~uVar21 & CONCAT44(bx.bigend.vect[1],bx.bigend.vect[0]) |
           mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
           _0_8_ & uVar21;
      uVar9 = bx.bigend.vect[2];
      if (mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
          m_bndryReg.m_crse_ratio.vect[0] < bx.bigend.vect[2]) {
        uVar9 = mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                m_op.m_bndryReg.m_crse_ratio.vect[0];
      }
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
      m_bndryReg.m_crse_ratio.vect[0] = uVar9;
      InterpolaterBoxCoarsener::doit((Box *)&mfi,&local_238,(Box *)&mf_crse_patch);
      BoxArray::set(&ba_crse_patch,(int)uVar15,(Box *)&mfi);
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uVar13 & 0x7fffffff));
  }
  MultiFab::MultiFab(&mf_crse_patch);
  pIVar7 = EB2::TopIndexSpaceIfPresent();
  iVar14 = local_2fc;
  if (pIVar7 == (IndexSpace *)0x0) {
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
    mfi.fabArray._0_4_ = 0;
    mfi.fabArray._4_4_ = 0;
    mfi.tile_size.vect[0] = 0;
    mfi.tile_size.vect[1] = 0;
    mfi.tile_size.vect[2] = 0;
    mfi.flags = '\0';
    mfi._29_3_ = 0;
    mfi.currentIndex = 0;
    mfi.beginIndex = 0;
    local_248.vect._0_8_ = &PTR__FabFactory_008378d0;
    MultiFab::define(&mf_crse_patch,&ba_crse_patch,dm,local_2fc,0,(MFInfo *)&mfi,
                     (FabFactory<amrex::FArrayBox> *)&local_248);
    iVar17 = local_300;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mfi.tile_size);
  }
  else {
    local_248.vect._0_8_ = (undefined **)0x0;
    local_248.vect[2] = 0;
    __l._M_len = 3;
    __l._M_array = local_248.vect;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&mfi,__l,&local_301);
    iVar14 = local_2fc;
    iVar17 = local_300;
    makeEBFabFactory((amrex *)&factory,cgeom,&ba_crse_patch,dm,
                     (Vector<int,_std::allocator<int>_> *)&mfi,basic);
    pvVar6 = (void *)CONCAT44(mfi.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl.
                              _4_4_,(int)mfi.m_fa._M_t.
                                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                         _M_head_impl);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,CONCAT44(mfi.tile_size.vect[1],mfi.tile_size.vect[0]) - (long)pvVar6);
    }
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
    mfi.fabArray._0_4_ = 0;
    mfi.fabArray._4_4_ = 0;
    mfi.tile_size.vect[0] = 0;
    mfi.tile_size.vect[1] = 0;
    mfi.tile_size.vect[2] = 0;
    mfi.flags = '\0';
    mfi._29_3_ = 0;
    mfi.currentIndex = 0;
    mfi.beginIndex = 0;
    MultiFab::define(&mf_crse_patch,&ba_crse_patch,dm,iVar14,0,(MFInfo *)&mfi,
                     (FabFactory<amrex::FArrayBox> *)
                     factory._M_t.
                     super___uniq_ptr_impl<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                     .super__Head_base<0UL,_amrex::EBFArrayBoxFactory_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mfi.tile_size);
    if ((__uniq_ptr_impl<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
        )factory._M_t.
         super___uniq_ptr_impl<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
         ._M_t.
         super__Tuple_impl<0UL,_amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_>
         .super__Head_base<0UL,_amrex::EBFArrayBoxFactory_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
        )0x0) {
      (**(code **)(*(long *)factory._M_t.
                            super___uniq_ptr_impl<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                            .super__Head_base<0UL,_amrex::EBFArrayBoxFactory_*,_false>._M_head_impl
                  + 8))();
    }
  }
  FabArray<amrex::FArrayBox>::setDomainBndry<amrex::FArrayBox,_0>
            (&mf_crse_patch.super_FabArray<amrex::FArrayBox>,NAN,0,
             mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,cgeom);
  _factory = Geometry::periodicity(cgeom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  mfi.fabArray._0_4_ = 0;
  local_248.vect[0] = 0;
  local_248.vect[1] = 0;
  local_248.vect[2] = 0;
  FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            (&mf_crse_patch.super_FabArray<amrex::FArrayBox>,&cmf->super_FabArray<amrex::FArrayBox>,
             scomp,0,iVar14,(IntVect *)&mfi,&local_248,(Periodicity *)&factory,COPY,(CPC *)0x0,false
            );
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
       mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0];
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
       mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[1];
  mfi.fabArray._0_4_ =
       mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[2];
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::operator()
            (cbc,&mf_crse_patch,0,iVar14,(IntVect *)&mfi,time,cbccomp);
  MFIter::MFIter(&mfi,(FabArrayBase *)&mf_crse_patch,'\0');
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  FillPatchInterp<amrex::MultiFab>
            (mf,iVar17,&mf_crse_patch,0,iVar14,nghost,cgeom,fgeom,&bx,ratio,mapper,bcs,bcscomp);
  MFIter::MFIter(&mfi,(FabArrayBase *)mf,'\0');
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::operator()
            (fbc,mf,iVar17,iVar14,nghost,time,fbccomp);
  MultiFab::~MultiFab(&mf_crse_patch);
  BoxArray::~BoxArray(&ba_crse_patch);
  InterpolaterBoxCoarsener::~InterpolaterBoxCoarsener(&local_238);
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
InterpFromCoarseLevel (MF& mf, IntVect const& nghost, Real time,
                       const MF& cmf, int scomp, int dcomp, int ncomp,
                       const Geometry& cgeom, const Geometry& fgeom,
                       BC& cbc, int cbccomp,
                       BC& fbc, int fbccomp,
                       const IntVect& ratio,
                       Interp* mapper,
                       const Vector<BCRec>& bcs, int bcscomp,
                       const PreInterpHook& pre_interp,
                       const PostInterpHook& post_interp)
{
    using FAB = typename MF::FABType::value_type;

    const InterpolaterBoxCoarsener& coarsener = mapper->BoxCoarsener(ratio);

    const BoxArray& ba = mf.boxArray();
    const DistributionMapping& dm = mf.DistributionMap();

    const IndexType& typ = ba.ixType();

    BL_ASSERT(typ == cmf.boxArray().ixType());

    Box fdomain_g( amrex::convert(fgeom.Domain(),mf.ixType()) );
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (fgeom.isPeriodic(i)) {
            fdomain_g.grow(i,nghost[i]);
        }
    }

    BoxArray ba_crse_patch(ba.size());
    {  // TODO: later we might want to cache this
        for (int i = 0, N = ba.size(); i < N; ++i)
        {
            Box bx = amrex::convert(amrex::grow(ba[i],nghost), typ);
            bx &= fdomain_g;
            ba_crse_patch.set(i, coarsener.doit(bx));
        }
    }

    MF mf_crse_patch;
#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        auto factory = makeEBFabFactory(cgeom, ba_crse_patch, dm, {0,0,0}, EBSupport::basic);
        mf_crse_patch.define(ba_crse_patch, dm, ncomp, 0, MFInfo(), *factory);
    } else
#endif
    {
        mf_crse_patch.define(ba_crse_patch, dm, ncomp, 0);
    }
    mf_set_domain_bndry (mf_crse_patch, cgeom);

    mf_crse_patch.ParallelCopy(cmf, scomp, 0, ncomp, cgeom.periodicity());

    cbc(mf_crse_patch, 0, ncomp, mf_crse_patch.nGrowVect(), time, cbccomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf_crse_patch); mfi.isValid(); ++mfi)
    {
        FAB& sfab   = mf_crse_patch[mfi];
        pre_interp(sfab, sfab.box(), 0, ncomp);
    }

    FillPatchInterp(mf, dcomp, mf_crse_patch, 0, ncomp, nghost, cgeom, fgeom, fdomain_g,
                    ratio, mapper, bcs, bcscomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        FAB& dfab   = mf[mfi];
        Box dfab_bx = dfab.box();
        dfab_bx.grow(nghost-mf.nGrowVect());
        const Box& dbx = dfab_bx & fdomain_g;

        post_interp(dfab, dbx, dcomp, ncomp);
    }

    fbc(mf, dcomp, ncomp, nghost, time, fbccomp);
}